

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O3

char * ngx_http_core_try_files(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  byte *pbVar1;
  size_t sVar2;
  u_char *puVar3;
  size_t *psVar4;
  ulong uVar5;
  void *pvVar6;
  ngx_uint_t nVar7;
  ngx_int_t nVar8;
  long lVar9;
  ulong uVar10;
  ngx_str_t *value;
  char *pcVar11;
  ngx_http_script_compile_t local_90;
  void *local_38;
  
  if (*(long *)((long)conf + 0x248) == 0) {
    *(undefined8 *)(*(long *)(*cf->ctx + ngx_http_core_module.ctx_index * 8) + 0xe8) = 1;
    pvVar6 = ngx_pcalloc(cf->pool,cf->args->nelts * 0x28);
    pcVar11 = (char *)0xffffffffffffffff;
    if (pvVar6 != (void *)0x0) {
      *(void **)((long)conf + 0x248) = pvVar6;
      if (cf->args->nelts == 1) {
        lVar9 = 0;
      }
      else {
        value = (ngx_str_t *)((long)pvVar6 + 0x10);
        uVar5 = 2;
        psVar4 = (size_t *)cf->args->elts;
        local_38 = pvVar6;
        do {
          uVar10 = uVar5;
          puVar3 = (u_char *)psVar4[3];
          value->len = psVar4[2];
          value->data = puVar3;
          sVar2 = value->len;
          if (((sVar2 != 0) && (puVar3 = value->data, puVar3[sVar2 - 1] == '/')) &&
             (uVar10 < cf->args->nelts)) {
            pbVar1 = (byte *)((long)&value[1].len + 1);
            *pbVar1 = *pbVar1 | 4;
            value->len = sVar2 - 1;
            puVar3[sVar2 - 1] = '\0';
          }
          nVar7 = ngx_http_script_variables_count(value);
          if (nVar7 == 0) {
            value->len = value->len + 1;
          }
          else {
            local_90.lengths = (ngx_array_t **)(value + -1);
            local_90.size = 0;
            local_90.main = (void *)0x0;
            local_90.ncaptures = 0;
            local_90.captures_mask = 0;
            local_90.flushes = (ngx_array_t **)0x0;
            local_90.values = (ngx_array_t **)&value[-1].data;
            local_90._80_8_ = 6;
            local_90.cf = cf;
            local_90.source = value;
            local_90.variables = nVar7;
            nVar8 = ngx_http_script_compile(&local_90);
            if (nVar8 != 0) {
              return (char *)0xffffffffffffffff;
            }
          }
          value = (ngx_str_t *)&value[2].data;
          uVar5 = uVar10 + 1;
          psVar4 = psVar4 + 2;
        } while (uVar10 - 1 < cf->args->nelts - 1);
        lVar9 = uVar10 - 1;
        pvVar6 = local_38;
      }
      pcVar11 = *(char **)((long)pvVar6 + lVar9 * 0x28 + -0x10);
      if (*pcVar11 == '=') {
        nVar8 = ngx_atoi((u_char *)(pcVar11 + 1),*(long *)((long)pvVar6 + lVar9 * 0x28 + -0x18) - 2)
        ;
        if (nVar8 == -1 || 999 < nVar8) {
          ngx_conf_log_error(1,cf,0,"invalid code \"%*s\"",
                             *(long *)((long)pvVar6 + lVar9 * 0x28 + -0x18) + -1,
                             *(undefined8 *)((long)pvVar6 + lVar9 * 0x28 + -0x10));
          return (char *)0xffffffffffffffff;
        }
        *(ushort *)((long)pvVar6 + lVar9 * 0x28 + 0x20) =
             (ushort)*(undefined4 *)((long)pvVar6 + lVar9 * 0x28 + 0x20) & 0xfc00 |
             (ushort)nVar8 & 0x3ff;
      }
      pcVar11 = (char *)0x0;
    }
  }
  else {
    pcVar11 = "is duplicate";
  }
  return pcVar11;
}

Assistant:

static char *
ngx_http_core_try_files(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_core_loc_conf_t *clcf = conf;

    ngx_str_t                  *value;
    ngx_int_t                   code;
    ngx_uint_t                  i, n;
    ngx_http_try_file_t        *tf;
    ngx_http_script_compile_t   sc;
    ngx_http_core_main_conf_t  *cmcf;

    if (clcf->try_files) {
        return "is duplicate";
    }

    cmcf = ngx_http_conf_get_module_main_conf(cf, ngx_http_core_module);

    cmcf->try_files = 1;

    tf = ngx_pcalloc(cf->pool, cf->args->nelts * sizeof(ngx_http_try_file_t));
    if (tf == NULL) {
        return NGX_CONF_ERROR;
    }

    clcf->try_files = tf;

    value = cf->args->elts;

    for (i = 0; i < cf->args->nelts - 1; i++) {

        tf[i].name = value[i + 1];

        if (tf[i].name.len > 0
            && tf[i].name.data[tf[i].name.len - 1] == '/'
            && i + 2 < cf->args->nelts)
        {
            tf[i].test_dir = 1;
            tf[i].name.len--;
            tf[i].name.data[tf[i].name.len] = '\0';
        }

        n = ngx_http_script_variables_count(&tf[i].name);

        if (n) {
            ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

            sc.cf = cf;
            sc.source = &tf[i].name;
            sc.lengths = &tf[i].lengths;
            sc.values = &tf[i].values;
            sc.variables = n;
            sc.complete_lengths = 1;
            sc.complete_values = 1;

            if (ngx_http_script_compile(&sc) != NGX_OK) {
                return NGX_CONF_ERROR;
            }

        } else {
            /* add trailing '\0' to length */
            tf[i].name.len++;
        }
    }

    if (tf[i - 1].name.data[0] == '=') {

        code = ngx_atoi(tf[i - 1].name.data + 1, tf[i - 1].name.len - 2);

        if (code == NGX_ERROR || code > 999) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "invalid code \"%*s\"",
                               tf[i - 1].name.len - 1, tf[i - 1].name.data);
            return NGX_CONF_ERROR;
        }

        tf[i].code = code;
    }

    return NGX_CONF_OK;
}